

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O2

void __thiscall Lexer::Lexer(Lexer *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  undefined4 *puVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  *ppVar4;
  initializer_list<std::pair<const_char,_lexemtype>_> __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>
  __l_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>
  __l_01;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_106;
  allocator_type local_105;
  lexemtype local_104;
  lexemtype local_100;
  lexemtype local_fc [3];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  local_c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  local_a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  local_78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  local_50;
  
  puVar3 = &DAT_0010a374;
  ppVar4 = &local_f0;
  for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(undefined4 *)&(ppVar4->first)._M_dataplus._M_p = *puVar3;
    puVar3 = puVar3 + 1;
    ppVar4 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
              *)((long)&(ppVar4->first)._M_dataplus._M_p + 4);
  }
  __l._M_len = 0xe;
  __l._M_array = (iterator)&local_f0;
  std::map<char,_lexemtype,_std::less<char>,_std::allocator<std::pair<const_char,_lexemtype>_>_>::
  map(&this->SYMBOLS,__l,(less<char> *)&local_100,(allocator_type *)&local_104);
  local_100 = RETURNKW;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  ::pair<const_char_(&)[7],_lexemtype,_true>(&local_f0,(char (*) [7])"return",&local_100);
  local_104 = IFKW;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  ::pair<const_char_(&)[3],_lexemtype,_true>(&local_c8,(char (*) [3])"if",&local_104);
  local_fc[2] = 9;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  ::pair<const_char_(&)[5],_lexemtype,_true>(&local_a0,(char (*) [5])"else",local_fc + 2);
  local_fc[1] = 0xb;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  ::pair<const_char_(&)[6],_lexemtype,_true>(&local_78,(char (*) [6])"while",local_fc + 1);
  local_fc[0] = FORKW;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  ::pair<const_char_(&)[4],_lexemtype,_true>(&local_50,(char (*) [4])"for",local_fc);
  __l_00._M_len = 5;
  __l_00._M_array = &local_f0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>
  ::map(&this->KEYWORDS,__l_00,&local_106,&local_105);
  lVar2 = 0xa0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_f0.first._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x28);
  local_100 = INTKW;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  ::pair<const_char_(&)[4],_lexemtype,_true>(&local_f0,(char (*) [4])"int",&local_100);
  local_104 = DOUBLEKW;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  ::pair<const_char_(&)[7],_lexemtype,_true>(&local_c8,(char (*) [7])"double",&local_104);
  local_fc[2] = 0x17;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  ::pair<const_char_(&)[5],_lexemtype,_true>(&local_a0,(char (*) [5])"char",local_fc + 2);
  local_fc[1] = 0x18;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  ::pair<const_char_(&)[6],_lexemtype,_true>(&local_78,(char (*) [6])"float",local_fc + 1);
  __l_01._M_len = 4;
  __l_01._M_array = &local_f0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>
  ::map(&this->DATA_TYPES,__l_01,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        local_fc,(allocator_type *)&local_106);
  lVar2 = 0x78;
  do {
    std::__cxx11::string::~string((string *)((long)&local_f0.first._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x28);
  this->ch = ' ';
  *(undefined8 *)&this->lexem = 0;
  (this->lexem).value._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&(this->lexem).value.field_2 + 8) = 0;
  (this->lexem).value._M_string_length = 0;
  (this->lexem).value.field_2._M_allocated_capacity = 0;
  (this->lexem).value._M_dataplus._M_p = (pointer)&(this->lexem).value.field_2;
  (this->lexem).value.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->table)._M_t._M_impl.super__Rb_tree_header;
  (this->table)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->table)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->table)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Lexer() = default;